

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O2

ArrayRef<int> * __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::ReadIntSuffix
          (ArrayRef<int> *__return_storage_ptr__,BasicProblem<mp::BasicProblemParams<int>_> *this,
          SuffixDef<int> *sufdef)

{
  Error *this_00;
  int *in_R8;
  undefined1 local_c4 [4];
  undefined1 local_c0 [56];
  ArrayRef<double> suf_dbl;
  ArrayRef<int> suf_int;
  char *local_38;
  size_t sStack_30;
  
  ReadSuffix_OneTypeOnly<int>(&suf_int,this,sufdef);
  if (suf_int.size_ == 0) {
    SuffixDef<int>::to_type<double>((SuffixDef<double> *)local_c0,sufdef);
    ReadSuffix_OneTypeOnly<double>(&suf_dbl,this,(SuffixDef<double> *)local_c0);
    std::__cxx11::string::~string((string *)(local_c0 + 0x18));
    if (suf_dbl.size_ != 0) {
      this_00 = (Error *)__cxa_allocate_exception(0x18);
      local_38 = (sufdef->name_).data_;
      sStack_30 = (sufdef->name_).size_;
      local_c4 = (undefined1  [4])sufdef->kind_;
      fmt::format<fmt::BasicStringRef<char>,int>
                ((string *)local_c0,
                 (fmt *)"Expected integer suffix .{}, kind {},\nbut fractional values provided",
                 (CStringRef)&local_38,(BasicStringRef<char> *)local_c4,in_R8);
      Error::Error(this_00,(CStringRef)local_c0._0_8_,-1);
      __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
    }
    (__return_storage_ptr__->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->data_ = (int *)0x0;
    (__return_storage_ptr__->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __return_storage_ptr__->size_ = 0;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&suf_dbl);
  }
  else {
    ArrayRef<int>::ArrayRef(__return_storage_ptr__,&suf_int);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&suf_int);
  return __return_storage_ptr__;
}

Assistant:

ArrayRef<int> ReadIntSuffix(const SuffixDef<int>& sufdef) {
    auto suf_int = ReadSuffix_OneTypeOnly(sufdef);
    if (!suf_int) {
      auto suf_dbl = ReadSuffix_OneTypeOnly(sufdef.to_type<double>());
      MP_ASSERT_ALWAYS(!suf_dbl,
                       fmt::format("Expected integer suffix .{}, kind {},\n"
                                   "but fractional values provided",
                                   sufdef.name(), sufdef.kind()));
      return {};
    }
    return suf_int;
  }